

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  int in_ESI;
  long in_RDI;
  int count;
  int in_stack_ffffffffffffff7c;
  EpsCopyInputStream *in_stack_ffffffffffffff80;
  undefined4 local_64;
  
  if (*(long *)(in_RDI + 0x10) == in_RDI + 0x28) {
    local_64 = ((int)*(undefined8 *)(in_RDI + 8) + 0x10) - in_ESI;
  }
  else {
    local_64 = *(int *)(in_RDI + 0x18) + ((int)*(undefined8 *)(in_RDI + 8) - in_ESI);
  }
  if (0 < local_64) {
    StreamBackUp(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  return;
}

Assistant:

void BackUp(const char* ptr) {
    GOOGLE_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == buffer_) {
      count = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }